

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::TestRunStats(TestRunStats *this,TestRunStats *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  Totals *in_stack_ffffffffffffffc8;
  Totals *this_00;
  
  *in_RDI = &PTR__TestRunStats_00a1ba80;
  this_00 = (Totals *)(in_RDI + 1);
  TestRunInfo::TestRunInfo((TestRunInfo *)this_00,(TestRunInfo *)in_stack_ffffffffffffffc8);
  Totals::Totals(this_00,in_stack_ffffffffffffffc8);
  *(byte *)(in_RDI + 0x13) = *(byte *)(in_RSI + 0x98) & 1;
  return;
}

Assistant:

TestRunStats( TestRunStats const& )              = default;